

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManPrintEquivs(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  long lVar4;
  ulong uVar5;
  
  printf("Const0:");
  for (uVar5 = 0; (long)uVar5 < (long)p->nObjs; uVar5 = uVar5 + 1) {
    pGVar3 = Gia_ManObj(p,(int)uVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if (((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) &&
       (((uint)p->pReprs[uVar5] & 0xfffffff) == 0)) {
      printf(" %d",uVar5 & 0xffffffff);
    }
  }
  putchar(10);
  uVar5 = 1;
  do {
    if ((long)p->nObjs <= (long)uVar5) {
      return;
    }
    iVar2 = Gia_ObjIsHead(p,(int)uVar5);
    if (iVar2 != 0) {
      printf("%d:",uVar5 & 0xffffffff);
      iVar2 = Gia_ObjIsHead(p,(int)uVar5);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsHead(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                      ,0x12ba,"void Gia_ManPrintEquivs(Gia_Man_t *)");
      }
      lVar4 = uVar5 * 4;
      while( true ) {
        uVar1 = *(uint *)(lVar4 + (long)p->pNexts);
        if ((long)(int)uVar1 < 1) break;
        printf(" %d",(ulong)uVar1);
        lVar4 = (long)(int)uVar1 << 2;
      }
      putchar(10);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void Gia_ManPrintEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iObj;
    printf( "Const0:" );
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjRepr(p, i) == 0 )
            printf( " %d", i );
    printf( "\n" );
    Gia_ManForEachClass( p, i )
    {
        printf( "%d:", i );
        Gia_ClassForEachObj1( p, i, iObj )
            printf( " %d", iObj );
        printf( "\n" );
    }
}